

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

ExprPtr __thiscall mathiu::impl::operator<=(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var4;
  undefined8 *puVar5;
  _func_int **pp_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ExprPtr EVar8;
  undefined1 local_61;
  double local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  _func_int *p_Stack_50;
  _func_int *local_48;
  _func_int *p_Stack_40;
  uint local_38;
  undefined1 local_30;
  undefined1 local_2f [7];
  ExprPtr *local_28;
  ExprPtr *local_20;
  
  bVar3 = equal(lhs,rhs);
  if (bVar3) {
    *(undefined8 *)this = true_;
    lVar2 = DAT_0026d670;
    *(long *)(this + 8) = DAT_0026d670;
    _Var7._M_pi = extraout_RDX;
    if (lVar2 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      }
    }
  }
  else {
    local_48 = (_func_int *)local_2f;
    local_58 = 0;
    p_Stack_50 = (_func_int *)&local_61;
    p_Stack_40 = (_func_int *)&local_30;
    local_28 = lhs;
    local_20 = rhs;
    bVar3 = std::operator()(&local_58,lhs,rhs);
    if (bVar3) {
      local_60 = evald(local_28);
      dVar1 = evald(local_20);
      puVar5 = &false_;
      if (local_60 <= dVar1) {
        puVar5 = &true_;
      }
      pp_Var6 = (_func_int **)*puVar5;
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_0026d688;
      if (local_60 <= dVar1) {
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_0026d670;
      }
      pp_Var4 = (_Var7._M_pi)->_vptr__Sp_counted_base;
      if (pp_Var4 != (_func_int **)0x0) {
        _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(pp_Var4 + 1) = *(int *)(pp_Var4 + 1) + 1;
          UNLOCK();
        }
        else {
          *(int *)(pp_Var4 + 1) = *(int *)(pp_Var4 + 1) + 1;
        }
      }
    }
    else {
      std::
      _Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
      ::_Tuple_impl((_Tuple_impl<1UL,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                     *)&local_58,lhs,rhs);
      local_38 = 2;
      pp_Var4 = (_func_int **)operator_new(0x50);
      pp_Var4[1] = (_func_int *)0x100000001;
      *pp_Var4 = (_func_int *)&PTR___Sp_counted_ptr_inplace_00263778;
      pp_Var6 = pp_Var4 + 2;
      pp_Var4[2] = (_func_int *)CONCAT44(uStack_54,local_58);
      pp_Var4[3] = p_Stack_50;
      pp_Var4[4] = local_48;
      pp_Var4[5] = p_Stack_40;
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)local_38;
      *(uint *)(pp_Var4 + 6) = local_38;
      *(undefined1 *)(pp_Var4 + 9) = 0xf;
    }
    *(_func_int ***)this = pp_Var6;
    *(_func_int ***)(this + 8) = pp_Var4;
  }
  EVar8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  EVar8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator<=(ExprPtr const &lhs, ExprPtr const &rhs)
    {
        if (equal(lhs, rhs))
        {
            return true_;
        }
        return match(lhs, rhs)(
            pattern | ds(asDouble, asDouble) = [&]
            { return evald(lhs) <= evald(rhs) ? true_ : false_; },
            pattern | _ = [&]
            { return makeSharedExprPtr(Relational{RelationalKind::kLESS_EQUAL, lhs, rhs}); });
    }